

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

int nk_do_selectable(nk_flags *state,nk_command_buffer *out,nk_rect bounds,char *str,int len,
                    nk_flags align,int *value,nk_style_selectable *style,nk_input *in,
                    nk_user_font *font)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  nk_rect r;
  nk_rect bounds_local;
  
  bounds_local = bounds;
  if (state == (nk_flags *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5102,
                  "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (out == (nk_command_buffer *)0x0) {
    __assert_fail("out",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5103,
                  "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (str == (char *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5104,
                  "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  if (len != 0) {
    if (value == (int *)0x0) {
      __assert_fail("value",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x5106,
                    "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                   );
    }
    if (style != (nk_style_selectable *)0x0) {
      if (font != (nk_user_font *)0x0) {
        iVar3 = *value;
        bounds_local.x = bounds.x;
        bounds_local.y = bounds.y;
        fVar1 = (style->touch_padding).x;
        fVar2 = (style->touch_padding).y;
        r.x = bounds_local.x - fVar1;
        bounds_local.w = bounds.w;
        r.w = fVar1 + fVar1 + bounds_local.w;
        bounds_local.h = bounds.h;
        r.h = fVar2 + fVar2 + bounds_local.h;
        r.y = bounds_local.y - fVar2;
        iVar4 = nk_button_behavior(state,r,in,NK_BUTTON_DEFAULT);
        if (iVar4 != 0) {
          *value = (uint)(*value == 0);
        }
        if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
          (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
        }
        nk_draw_selectable(out,*state,style,*value,&bounds_local,(nk_rect *)0x0,(nk_image *)0x0,
                           NK_SYMBOL_NONE,str,len,align,font);
        if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
          (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
        }
        return (int)(iVar3 != *value);
      }
      __assert_fail("font",
                    "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                    ,0x5108,
                    "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                   );
    }
    __assert_fail("style",
                  "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h"
                  ,0x5107,
                  "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
                 );
  }
  __assert_fail("len",
                "/workspace/llm4binary/github/license_c_cmakelists/TheCherno[P]glfw/deps/nuklear.h",
                0x5105,
                "int nk_do_selectable(nk_flags *, struct nk_command_buffer *, struct nk_rect, const char *, int, nk_flags, int *, const struct nk_style_selectable *, const struct nk_input *, const struct nk_user_font *)"
               );
}

Assistant:

NK_LIB int
nk_do_selectable(nk_flags *state, struct nk_command_buffer *out,
    struct nk_rect bounds, const char *str, int len, nk_flags align, int *value,
    const struct nk_style_selectable *style, const struct nk_input *in,
    const struct nk_user_font *font)
{
    int old_value;
    struct nk_rect touch;

    NK_ASSERT(state);
    NK_ASSERT(out);
    NK_ASSERT(str);
    NK_ASSERT(len);
    NK_ASSERT(value);
    NK_ASSERT(style);
    NK_ASSERT(font);

    if (!state || !out || !str || !len || !value || !style || !font) return 0;
    old_value = *value;

    /* remove padding */
    touch.x = bounds.x - style->touch_padding.x;
    touch.y = bounds.y - style->touch_padding.y;
    touch.w = bounds.w + style->touch_padding.x * 2;
    touch.h = bounds.h + style->touch_padding.y * 2;

    /* update button */
    if (nk_button_behavior(state, touch, in, NK_BUTTON_DEFAULT))
        *value = !(*value);

    /* draw selectable */
    if (style->draw_begin) style->draw_begin(out, style->userdata);
    nk_draw_selectable(out, *state, style, *value, &bounds, 0,0,NK_SYMBOL_NONE, str, len, align, font);
    if (style->draw_end) style->draw_end(out, style->userdata);
    return old_value != *value;
}